

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::negI8x16(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  Literal *in_RDX;
  Literal *this_01;
  long lVar1;
  undefined1 local_1e0 [8];
  LaneArray<16> lanes;
  Literal local_48;
  
  getLanes<unsigned_char,16>((LaneArray<16> *)local_1e0,(wasm *)this,in_RDX);
  this_00 = &lanes._M_elems[0xf].type;
  for (lVar1 = 0; lVar1 != 0x180; lVar1 = lVar1 + 0x18) {
    this_01 = (Literal *)(local_1e0 + lVar1);
    neg(&local_48,this_01);
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
  }
  Literal(__return_storage_ptr__,(LaneArray<16> *)local_1e0);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::negI8x16() const {
  return unary<16, &Literal::getLanesUI8x16, &Literal::neg>(*this);
}